

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.h
# Opt level: O0

bool __thiscall cppcms::widgets::numeric<int>::validate(numeric<int> *this)

{
  char cVar1;
  ulong uVar2;
  long *in_RDI;
  bool local_1;
  
  uVar2 = cppcms::widgets::base_widget::valid();
  if ((uVar2 & 1) == 0) {
    local_1 = false;
  }
  else {
    uVar2 = cppcms::widgets::base_widget::set();
    cVar1 = (char)in_RDI;
    if ((uVar2 & 1) == 0) {
      if ((*(byte *)((long)in_RDI + 0x3e) & 1) == 0) {
        local_1 = true;
      }
      else {
        cppcms::widgets::base_widget::valid((bool)(cVar1 + (char)*(undefined8 *)(*in_RDI + -0x18)));
        local_1 = false;
      }
    }
    else if (((*(byte *)((long)in_RDI + 0x3c) & 1) == 0) || ((int)in_RDI[6] <= (int)in_RDI[7])) {
      if (((*(byte *)((long)in_RDI + 0x3d) & 1) == 0) ||
         ((int)in_RDI[7] <= *(int *)((long)in_RDI + 0x34))) {
        local_1 = true;
      }
      else {
        cppcms::widgets::base_widget::valid((bool)(cVar1 + (char)*(undefined8 *)(*in_RDI + -0x18)));
        local_1 = false;
      }
    }
    else {
      cppcms::widgets::base_widget::valid((bool)(cVar1 + (char)*(undefined8 *)(*in_RDI + -0x18)));
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

virtual bool validate()
			{
				if(!valid())
					return false;
				if(!set()) {
					if(non_empty_) {
						valid(false);
						return false;
					}
					return true;
				}
				if(check_low_ && value_ <min_) {
					valid(false);
					return false;
				}
				if(check_high_ && value_ > max_) {
					valid(false);
					return false;
				}
				return true;
			}